

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O2

void __thiscall
FZipExploder::InsertCode
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          uint pos,int bits,unsigned_short code,int len,uchar value)

{
  HuffNode *pHVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  uint uVar5;
  char *__assertion;
  int iVar6;
  uint uVar7;
  
  uVar7 = (uint)code;
  do {
    if (len < 1) {
      __assertion = "len > 0";
      uVar7 = 0x60;
LAB_004c1abe:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                    ,uVar7,
                    "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                   );
    }
    bVar3 = (byte)bits;
    uVar5 = (~(-1 << (bVar3 & 0x1f)) & uVar7 & 0xffff) + pos;
    iVar6 = len - bits;
    if (iVar6 == 0 || len < bits) {
      bVar2 = (byte)len;
      pHVar1 = decoder->Array;
      iVar6 = (1 << (bVar3 - bVar2 & 0x1f)) + 1;
      do {
        iVar6 = iVar6 + -1;
        if (iVar6 < 1) {
          return;
        }
        pHVar1[uVar5].Length = bVar2;
        pHVar1[uVar5].Value = value;
        uVar4 = (ulong)uVar5;
        uVar5 = uVar5 + (1 << (bVar2 & 0x1f));
      } while (pHVar1[uVar4].ChildTable == 0);
      __assertion = "decoder[node].ChildTable == 0";
      uVar7 = 0x7d;
      goto LAB_004c1abe;
    }
    pHVar1 = decoder->Array;
    pos = (uint)pHVar1[uVar5].ChildTable;
    if (pHVar1[uVar5].ChildTable == 0) {
      pos = InitTable(this,decoder,0x10);
      pHVar1 = decoder->Array;
      pHVar1[uVar5].ChildTable = (unsigned_short)pos;
      pHVar1[uVar5].Length = bVar3;
      pHVar1[uVar5].Value = '\0';
    }
    else {
      if (bits != (uint)pHVar1[uVar5].Length) {
        __assertion = "decoder[node].Length == bits";
        uVar7 = 0x70;
        goto LAB_004c1abe;
      }
      if (pHVar1[uVar5].Value != '\0') {
        __assertion = "decoder[node].Value == 0";
        uVar7 = 0x71;
        goto LAB_004c1abe;
      }
    }
    uVar7 = (uVar7 & 0xffff) >> (bVar3 & 0x1f);
    bits = 4;
    len = iVar6;
  } while( true );
}

Assistant:

void FZipExploder::InsertCode(TArray<HuffNode> &decoder, unsigned int pos, int bits, unsigned short code, int len, unsigned char value)
{
	assert(len > 0);
	unsigned int node = pos + (code & ((1 << bits) - 1));

	if (len > bits)
	{ // This code uses more bits than this level has room for. Store the bottom bits
	  // in this table, then proceed to the next one.
		unsigned int child = decoder[node].ChildTable;
		if (child == 0)
		{ // Need to create child table.
			child = InitTable(decoder, 1 << REST_BIT_LEN);
			decoder[node].ChildTable = child;
			decoder[node].Length = bits;
			decoder[node].Value = 0;
		}
		else
		{
			assert(decoder[node].Length == bits);
			assert(decoder[node].Value == 0);
		}
		InsertCode(decoder, child, REST_BIT_LEN, code >> bits, len - bits, value);
	}
	else
	{ // If this code uses fewer bits than this level of the table, it is
	  // inserted repeatedly for each value that matches it at its lower
	  // bits.
		for (int i = 1 << (bits - len); --i >= 0; node += 1 << len)
		{
			decoder[node].Length = len;
			decoder[node].Value = value;
			assert(decoder[node].ChildTable == 0);
		}
	}
}